

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1512.c
# Opt level: O1

int test(char *URL)

{
  char *pcVar1;
  char *pcVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  undefined8 uVar7;
  long lVar8;
  CURL *curl [2];
  char target_url [256];
  char dnsentry [256];
  long local_258 [4];
  undefined1 local_238 [255];
  undefined1 local_139;
  undefined1 local_138 [264];
  
  pcVar2 = libtest_arg3;
  pcVar1 = libtest_arg2;
  local_258[0] = 0;
  local_258[1] = 0;
  iVar4 = curl_global_init(3);
  if (iVar4 != 0) {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    return 0x7e;
  }
  curl_msnprintf(local_138,0x100,"server.example.curl:%s:%s",pcVar2,pcVar1);
  curl_mprintf("%s\n",local_138);
  local_258[3] = curl_slist_append(0,local_138);
  lVar8 = 0;
  do {
    if (lVar8 == 2) {
      iVar5 = curl_easy_setopt(local_258[0],0x27db,local_258[3]);
      uVar3 = _stderr;
      iVar4 = 0;
      if (iVar5 != 0) {
        uVar7 = curl_easy_strerror(iVar5);
        curl_mfprintf(uVar3,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1512.c"
                      ,0x4c,iVar5,uVar7);
        iVar4 = iVar5;
      }
      if (iVar4 == 0) {
        lVar8 = 0;
        goto LAB_00102512;
      }
      break;
    }
    lVar6 = curl_easy_init();
    local_258[lVar8] = lVar6;
    if (lVar6 == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1512.c"
                    ,0x3c);
      iVar4 = 0x7c;
      break;
    }
    curl_msnprintf(local_238,0x100,"http://server.example.curl:%s/path/1512%04i",pcVar2,
                   (int)lVar8 + 1);
    local_139 = 0;
    iVar5 = curl_easy_setopt(lVar6,0x2712,local_238);
    uVar3 = _stderr;
    iVar4 = 0;
    if (iVar5 != 0) {
      uVar7 = curl_easy_strerror(iVar5);
      curl_mfprintf(uVar3,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1512.c"
                    ,0x42,iVar5,uVar7);
      iVar4 = iVar5;
    }
    if (iVar4 != 0) break;
    iVar5 = curl_easy_setopt(lVar6,0x29,1);
    uVar3 = _stderr;
    iVar4 = 0;
    if (iVar5 != 0) {
      uVar7 = curl_easy_strerror(iVar5);
      curl_mfprintf(uVar3,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1512.c"
                    ,0x44,iVar5,uVar7);
      iVar4 = iVar5;
    }
    if (iVar4 != 0) break;
    iVar5 = curl_easy_setopt(lVar6,0x2a,1);
    uVar3 = _stderr;
    iVar4 = 0;
    if (iVar5 != 0) {
      uVar7 = curl_easy_strerror(iVar5);
      curl_mfprintf(uVar3,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1512.c"
                    ,0x46,iVar5,uVar7);
      iVar4 = iVar5;
    }
    if (iVar4 != 0) break;
    iVar5 = curl_easy_setopt(lVar6,0x5b,1);
    uVar3 = _stderr;
    iVar4 = 0;
    if (iVar5 != 0) {
      uVar7 = curl_easy_strerror(iVar5);
      curl_mfprintf(uVar3,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1512.c"
                    ,0x48,iVar5,uVar7);
      iVar4 = iVar5;
    }
    lVar8 = lVar8 + 1;
  } while (iVar4 == 0);
  goto LAB_00102529;
  while (lVar8 = 1, iVar4 == 0) {
LAB_00102512:
    iVar4 = curl_easy_perform(local_258[lVar8]);
    if (lVar8 != 0) break;
  }
LAB_00102529:
  curl_easy_cleanup(local_258[0]);
  curl_easy_cleanup(local_258[1]);
  curl_slist_free_all(local_258[3]);
  curl_global_cleanup();
  return iVar4;
}

Assistant:

int test(char *URL)
{
  int res = 0;
  CURL *curl[NUM_HANDLES] = {NULL, NULL};
  char *port = libtest_arg3;
  char *address = libtest_arg2;
  char dnsentry[256];
  struct curl_slist *slist = NULL;
  int i;
  char target_url[256];
  (void)URL; /* URL is setup in the code */

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  msnprintf(dnsentry, sizeof(dnsentry), "server.example.curl:%s:%s",
            port, address);
  printf("%s\n", dnsentry);
  slist = curl_slist_append(slist, dnsentry);

  /* get NUM_HANDLES easy handles */
  for(i = 0; i < NUM_HANDLES; i++) {
    /* get an easy handle */
    easy_init(curl[i]);
    /* specify target */
    msnprintf(target_url, sizeof(target_url),
              "http://server.example.curl:%s/path/1512%04i",
              port, i + 1);
    target_url[sizeof(target_url) - 1] = '\0';
    easy_setopt(curl[i], CURLOPT_URL, target_url);
    /* go verbose */
    easy_setopt(curl[i], CURLOPT_VERBOSE, 1L);
    /* include headers */
    easy_setopt(curl[i], CURLOPT_HEADER, 1L);

    easy_setopt(curl[i], CURLOPT_DNS_USE_GLOBAL_CACHE, 1L);
  }

  /* make the first one populate the GLOBAL cache */
  easy_setopt(curl[0], CURLOPT_RESOLVE, slist);

  /* run NUM_HANDLES transfers */
  for(i = 0; (i < NUM_HANDLES) && !res; i++)
    res = curl_easy_perform(curl[i]);

test_cleanup:

  curl_easy_cleanup(curl[0]);
  curl_easy_cleanup(curl[1]);
  curl_slist_free_all(slist);
  curl_global_cleanup();

  return res;
}